

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O3

void __thiscall QXcbWindow::setImageFormatForVisual(QXcbWindow *this,xcb_visualtype_t *visual)

{
  uint uVar1;
  bool bVar2;
  Format FVar3;
  
  bVar2 = qt_xcb_imageFormatForVisual
                    ((this->super_QXcbObject).m_connection,(uint8_t)this->m_depth,visual,
                     &this->m_imageFormat,&this->m_imageRgbSwap);
  if (!bVar2) {
    uVar1 = this->m_depth;
    if (uVar1 == 0x10) {
      setImageFormatForVisual();
      FVar3 = Format_RGB16;
    }
    else {
      if ((uVar1 != 0x20) && (uVar1 != 0x18)) {
        return;
      }
      setImageFormatForVisual();
      FVar3 = Format_RGB32;
    }
    this->m_imageFormat = FVar3;
  }
  return;
}

Assistant:

void QXcbWindow::setImageFormatForVisual(const xcb_visualtype_t *visual)
{
    if (qt_xcb_imageFormatForVisual(connection(), m_depth, visual, &m_imageFormat, &m_imageRgbSwap))
        return;

    switch (m_depth) {
    case 32:
    case 24:
        qWarning("Using RGB32 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB32;
        break;
    case 16:
        qWarning("Using RGB16 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB16;
        break;
    default:
        break;
    }
}